

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fromucs.c
# Opt level: O0

void charset_emit(void *ctx,long output)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  int local_34;
  undefined1 *puStack_30;
  wchar_t outlen;
  char *p;
  char outval;
  charset_emit_param *param;
  long output_local;
  void *ctx_local;
  
  if (output == 0xffff) {
    puStack_30 = *(undefined1 **)((long)ctx + 0x10);
    local_34 = *(int *)((long)ctx + 0x18);
  }
  else {
    puStack_30 = (undefined1 *)((long)&p + 7);
    local_34 = 1;
  }
  if (*(int *)((long)ctx + 8) < local_34) {
    *(undefined4 *)((long)ctx + 0x1c) = 1;
  }
  else {
    for (; 0 < local_34; local_34 = local_34 + -1) {
      uVar1 = *puStack_30;
      puVar2 = *ctx;
      *(undefined1 **)ctx = puVar2 + 1;
      *puVar2 = uVar1;
      *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
      puStack_30 = puStack_30 + 1;
    }
  }
  return;
}

Assistant:

static void charset_emit(void *ctx, long int output)
{
    struct charset_emit_param *param = (struct charset_emit_param *)ctx;
    char outval;
    char const *p;
    int outlen;

    if (output == ERROR) {
        p = param->errstr;
        outlen = param->errlen;
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}